

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

bool __thiscall
TPZMatrix<int>::SolveEigensystemJacobi
          (TPZMatrix<int> *this,int64_t *numiterations,REAL *tol,TPZVec<int> *Eigenvalues,
          TPZFMatrix<int> *Eigenvectors)

{
  double dVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  bool bVar5;
  double dVar6;
  bool bVar7;
  int iVar8;
  ulong uVar9;
  int *piVar10;
  int64_t i;
  int64_t i_4;
  int64_t j;
  ulong uVar11;
  int64_t size;
  TPZFNMatrix<9,_int> Matrix_1;
  TPZFNMatrix<9,_int> Matrix;
  double local_3f8;
  long local_3a0;
  TPZFMatrix<int> local_398;
  int local_308 [4];
  double local_2f8;
  undefined8 uStack_2f0;
  _func_int **local_2e0;
  _func_int **local_2d8;
  TPZFMatrix<int> local_2d0;
  int local_240 [10];
  TPZFMatrix<int> local_218;
  int local_188 [4];
  TPZFMatrix<int> local_178;
  int local_e8 [10];
  TPZFMatrix<int> local_c0;
  
  lVar2 = *numiterations;
  dVar1 = *tol;
  uVar3 = (this->super_TPZBaseMatrix).fRow;
  local_178.fElem = local_e8;
  local_178.super_TPZMatrix<int>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_178.super_TPZMatrix<int>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_2d8 = (_func_int **)&PTR__TPZFMatrix_01848568;
  local_178.super_TPZMatrix<int>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_01848568;
  local_178.fSize = 9;
  local_178.super_TPZMatrix<int>.super_TPZBaseMatrix.fRow = uVar3;
  local_178.super_TPZMatrix<int>.super_TPZBaseMatrix.fCol = uVar3;
  local_178.fGiven = local_178.fElem;
  TPZVec<int>::TPZVec(&local_178.fPivot.super_TPZVec<int>,0);
  local_178.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_178.fPivot.super_TPZVec<int>.fStore = local_178.fPivot.fExtAlloc;
  local_178.fPivot.super_TPZVec<int>.fNElements = 0;
  local_178.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_178.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
  local_178.fWork.fStore = (int *)0x0;
  local_178.fWork.fNElements = 0;
  local_178.fWork.fNAlloc = 0;
  piVar10 = (int *)0x0;
  if ((uVar3 != 0) && (uVar9 = uVar3 * uVar3, piVar10 = local_178.fElem, 9 < uVar9)) {
    uVar11 = 0xffffffffffffffff;
    if (uVar9 >> 0x3e == 0) {
      uVar11 = uVar9 * 4;
    }
    piVar10 = (int *)operator_new__(uVar11);
  }
  local_178.fElem = piVar10;
  local_2e0 = (_func_int **)&PTR__TPZFNMatrix_01848278;
  local_178.super_TPZMatrix<int>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_01848278;
  if (0 < (long)uVar3) {
    uVar9 = 0;
    do {
      uVar11 = 0;
      do {
        iVar8 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])
                          (this,uVar9,uVar11);
        if ((local_178.super_TPZMatrix<int>.super_TPZBaseMatrix.fRow <= (long)uVar9) ||
           (local_178.super_TPZMatrix<int>.super_TPZBaseMatrix.fCol <= (long)uVar11)) {
          TPZFMatrix<int>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        local_178.fElem[local_178.super_TPZMatrix<int>.super_TPZBaseMatrix.fRow * uVar11 + uVar9] =
             iVar8;
        uVar11 = uVar11 + 1;
      } while (uVar3 != uVar11);
      uVar9 = uVar9 + 1;
    } while (uVar9 != uVar3);
  }
  bVar7 = SolveEigenvaluesJacobi(&local_178.super_TPZMatrix<int>,numiterations,tol,Eigenvalues);
  if (bVar7) {
    local_398.fElem = local_308;
    local_398.super_TPZMatrix<int>.super_TPZBaseMatrix.fCol = 1;
    local_398.super_TPZMatrix<int>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_398.super_TPZMatrix<int>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_398.super_TPZMatrix<int>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_01848f28;
    local_398.fSize = 3;
    local_398.super_TPZMatrix<int>.super_TPZBaseMatrix.fRow = uVar3;
    local_398.fGiven = local_398.fElem;
    TPZVec<int>::TPZVec(&local_398.fPivot.super_TPZVec<int>,0);
    local_398.fPivot.super_TPZVec<int>.fStore = local_398.fPivot.fExtAlloc;
    local_398.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
    local_398.fPivot.super_TPZVec<int>.fNElements = 0;
    local_398.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_398.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
    local_398.fWork.fStore = (int *)0x0;
    local_398.fWork.fNElements = 0;
    local_398.fWork.fNAlloc = 0;
    if (uVar3 == 0) {
      local_398.fElem = (int *)0x0;
    }
    else if (3 < (long)uVar3) {
      local_398.fElem = (int *)operator_new__(-(ulong)(uVar3 >> 0x3e != 0) | uVar3 * 4);
    }
    local_398.super_TPZMatrix<int>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFNMatrix_01848c38;
    TPZFMatrix<int>::operator=(&local_398,0);
    local_218.fElem = local_188;
    local_218.super_TPZMatrix<int>.super_TPZBaseMatrix.fCol = 1;
    local_218.super_TPZMatrix<int>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_218.super_TPZMatrix<int>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_218.super_TPZMatrix<int>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_01848f28;
    local_218.fSize = 3;
    local_218.super_TPZMatrix<int>.super_TPZBaseMatrix.fRow = uVar3;
    local_218.fGiven = local_218.fElem;
    TPZVec<int>::TPZVec(&local_218.fPivot.super_TPZVec<int>,0);
    local_218.fPivot.super_TPZVec<int>.fStore = local_218.fPivot.fExtAlloc;
    local_218.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
    local_218.fPivot.super_TPZVec<int>.fNElements = 0;
    local_218.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_218.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
    local_218.fWork.fStore = (int *)0x0;
    local_218.fWork.fNElements = 0;
    local_218.fWork.fNAlloc = 0;
    if (uVar3 == 0) {
      local_218.fElem = (int *)0x0;
    }
    else if (3 < (long)uVar3) {
      local_218.fElem = (int *)operator_new__(-(ulong)(uVar3 >> 0x3e != 0) | uVar3 * 4);
    }
    local_218.super_TPZMatrix<int>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFNMatrix_01848c38;
    TPZFMatrix<int>::operator=(&local_218,0);
    (*(Eigenvectors->super_TPZMatrix<int>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
      [0xd])(Eigenvectors,uVar3,uVar3);
    (*(Eigenvectors->super_TPZMatrix<int>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
      [0xf])(Eigenvectors);
    if (0 < (long)uVar3) {
      uVar9 = 0;
      do {
        uVar11 = 0;
        do {
          iVar8 = rand();
          local_398.fElem[uVar11] = iVar8;
          uVar11 = uVar11 + 1;
        } while (uVar3 != uVar11);
        TPZFMatrix<int>::TPZFMatrix(&local_c0,this);
        local_2d0.fElem = local_240;
        local_2d0.super_TPZMatrix<int>.super_TPZBaseMatrix.fRow = 0;
        local_2d0.super_TPZMatrix<int>.super_TPZBaseMatrix.fCol = 0;
        local_2d0.super_TPZMatrix<int>.super_TPZBaseMatrix.fDecomposed = '\0';
        local_2d0.super_TPZMatrix<int>.super_TPZBaseMatrix.fDefPositive = '\0';
        local_2d0.super_TPZMatrix<int>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
             local_2d8;
        local_2d0.fSize = 9;
        local_2d0.fGiven = local_2d0.fElem;
        TPZVec<int>::TPZVec(&local_2d0.fPivot.super_TPZVec<int>,0);
        local_2d0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
        local_2d0.fPivot.super_TPZVec<int>.fStore = local_2d0.fPivot.fExtAlloc;
        local_2d0.fPivot.super_TPZVec<int>.fNElements = 0;
        local_2d0.fPivot.super_TPZVec<int>.fNAlloc = 0;
        local_2d0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
        local_2d0.fWork.fNAlloc = 0;
        local_2d0.fWork.fStore = (int *)0x0;
        local_2d0.fWork.fNElements = 0;
        local_2d0.fElem = (int *)0x0;
        local_2d0.super_TPZMatrix<int>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
             local_2e0;
        TPZFMatrix<int>::operator=(&local_2d0,&local_c0);
        TPZFMatrix<int>::~TPZFMatrix(&local_c0);
        iVar8 = ReturnNearestValue(Eigenvalues->fStore[uVar9],Eigenvalues,0);
        dVar6 = ABS((double)(iVar8 - Eigenvalues->fStore[uVar9]));
        if (dVar6 <= 1e-05) {
          uVar11 = 0;
          do {
            iVar8 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                              (this,uVar11,uVar11);
            local_2d0.fElem
            [(uVar11 & 0xffffffff) * local_2d0.super_TPZMatrix<int>.super_TPZBaseMatrix.fRow +
             uVar11] = iVar8 - Eigenvalues->fStore[uVar9];
            uVar11 = uVar11 + 1;
          } while (uVar3 != uVar11);
        }
        else {
          uVar11 = 0;
          do {
            iVar8 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                              (this,uVar11,uVar11);
            local_2d0.fElem
            [(uVar11 & 0xffffffff) * local_2d0.super_TPZMatrix<int>.super_TPZBaseMatrix.fRow +
             uVar11] = (iVar8 + (int)(dVar6 * 0.01)) - Eigenvalues->fStore[uVar9];
            uVar11 = uVar11 + 1;
          } while (uVar3 != uVar11);
        }
        local_3f8 = 0.0;
        uVar11 = 0;
        do {
          if ((local_398.super_TPZMatrix<int>.super_TPZBaseMatrix.fRow <= (long)uVar11) ||
             (local_398.super_TPZMatrix<int>.super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<int>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          local_2f8 = ABS((double)local_398.fElem[uVar11]);
          if (local_398.super_TPZMatrix<int>.super_TPZBaseMatrix.fRow <= (long)uVar11) {
            uStack_2f0 = 0;
            TPZFMatrix<int>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          local_3f8 = local_3f8 + local_2f8 * local_2f8;
          uVar11 = uVar11 + 1;
        } while (uVar3 != uVar11);
        if (local_3f8 < 0.0) {
          local_3f8 = sqrt(local_3f8);
        }
        else {
          local_3f8 = SQRT(local_3f8);
        }
        uVar11 = 0;
        do {
          if ((local_398.super_TPZMatrix<int>.super_TPZBaseMatrix.fRow <= (long)uVar11) ||
             (local_398.super_TPZMatrix<int>.super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<int>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if (local_398.super_TPZMatrix<int>.super_TPZBaseMatrix.fRow <= (long)uVar11) {
            TPZFMatrix<int>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          local_398.fElem[uVar11] = local_398.fElem[uVar11] / (int)local_3f8;
          uVar11 = uVar11 + 1;
        } while (uVar3 != uVar11);
        if (-1 < lVar2 && dVar1 < 10.0) {
          local_3a0 = 0;
          do {
            uVar11 = 0;
            do {
              if ((local_398.super_TPZMatrix<int>.super_TPZBaseMatrix.fRow <= (long)uVar11) ||
                 (local_398.super_TPZMatrix<int>.super_TPZBaseMatrix.fCol < 1)) {
                TPZFMatrix<int>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              if ((local_218.super_TPZMatrix<int>.super_TPZBaseMatrix.fRow <= (long)uVar11) ||
                 (local_218.super_TPZMatrix<int>.super_TPZBaseMatrix.fCol < 1)) {
                TPZFMatrix<int>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              local_218.fElem[uVar11] = local_398.fElem[uVar11];
              uVar11 = uVar11 + 1;
            } while (uVar3 != uVar11);
            iVar8 = (*local_2d0.super_TPZMatrix<int>.super_TPZBaseMatrix.super_TPZSavable.
                      _vptr_TPZSavable[0x10])(&local_2d0);
            if (iVar8 != 0) {
              Error("LU decomposition is not a symmetric decomposition",(char *)0x0);
            }
            iVar8 = (*local_2d0.super_TPZMatrix<int>.super_TPZBaseMatrix.super_TPZSavable.
                      _vptr_TPZSavable[0x17])(&local_2d0);
            if (iVar8 != 0) {
              (*local_2d0.super_TPZMatrix<int>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
                [0x43])(&local_2d0);
            }
            local_3f8 = 0.0;
            uVar11 = 0;
            do {
              if ((local_398.super_TPZMatrix<int>.super_TPZBaseMatrix.fRow <= (long)uVar11) ||
                 (local_398.super_TPZMatrix<int>.super_TPZBaseMatrix.fCol < 1)) {
                TPZFMatrix<int>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              local_2f8 = ABS((double)local_398.fElem[uVar11]);
              if (local_398.super_TPZMatrix<int>.super_TPZBaseMatrix.fRow <= (long)uVar11) {
                uStack_2f0 = 0;
                TPZFMatrix<int>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              local_3f8 = local_3f8 + local_2f8 * local_2f8;
              uVar11 = uVar11 + 1;
            } while (uVar3 != uVar11);
            if (local_3f8 < 0.0) {
              dVar6 = sqrt(local_3f8);
            }
            else {
              dVar6 = SQRT(local_3f8);
            }
            local_3f8 = 0.0;
            uVar11 = 0;
            do {
              if ((local_398.super_TPZMatrix<int>.super_TPZBaseMatrix.fRow <= (long)uVar11) ||
                 (local_398.super_TPZMatrix<int>.super_TPZBaseMatrix.fCol < 1)) {
                TPZFMatrix<int>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              if (local_398.super_TPZMatrix<int>.super_TPZBaseMatrix.fRow <= (long)uVar11) {
                TPZFMatrix<int>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              local_398.fElem[uVar11] = local_398.fElem[uVar11] / (int)dVar6;
              if ((local_218.super_TPZMatrix<int>.super_TPZBaseMatrix.fRow <= (long)uVar11) ||
                 (local_218.super_TPZMatrix<int>.super_TPZBaseMatrix.fCol < 1)) {
                TPZFMatrix<int>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              if ((local_398.super_TPZMatrix<int>.super_TPZBaseMatrix.fRow <= (long)uVar11) ||
                 (local_398.super_TPZMatrix<int>.super_TPZBaseMatrix.fCol < 1)) {
                TPZFMatrix<int>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              if ((local_218.super_TPZMatrix<int>.super_TPZBaseMatrix.fRow <= (long)uVar11) ||
                 (local_218.super_TPZMatrix<int>.super_TPZBaseMatrix.fCol < 1)) {
                TPZFMatrix<int>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              if ((local_398.super_TPZMatrix<int>.super_TPZBaseMatrix.fRow <= (long)uVar11) ||
                 (local_398.super_TPZMatrix<int>.super_TPZBaseMatrix.fCol < 1)) {
                TPZFMatrix<int>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              local_3f8 = local_3f8 +
                          ABS((double)((local_218.fElem[uVar11] - local_398.fElem[uVar11]) *
                                      (local_218.fElem[uVar11] - local_398.fElem[uVar11])));
              uVar11 = uVar11 + 1;
            } while (uVar3 != uVar11);
            if (local_3f8 < 0.0) {
              local_3f8 = sqrt(local_3f8);
            }
            else {
              local_3f8 = SQRT(local_3f8);
            }
          } while ((dVar1 < local_3f8) &&
                  (bVar5 = local_3a0 < lVar2, local_3a0 = local_3a0 + 1, bVar5));
        }
        uVar11 = 0;
        do {
          if ((local_398.super_TPZMatrix<int>.super_TPZBaseMatrix.fRow <= (long)uVar11) ||
             (local_398.super_TPZMatrix<int>.super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<int>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          iVar8 = 0;
          if (1e-05 <= ABS((double)local_398.fElem[uVar11])) {
            iVar8 = local_398.fElem[uVar11];
          }
          lVar4 = (Eigenvectors->super_TPZMatrix<int>).super_TPZBaseMatrix.fRow;
          if ((lVar4 <= (long)uVar9) ||
             ((Eigenvectors->super_TPZMatrix<int>).super_TPZBaseMatrix.fCol <= (long)uVar11)) {
            TPZFMatrix<int>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          Eigenvectors->fElem[lVar4 * uVar11 + uVar9] = iVar8;
          uVar11 = uVar11 + 1;
        } while (uVar3 != uVar11);
        TPZFMatrix<int>::~TPZFMatrix(&local_2d0,&PTR_PTR_01848530);
        uVar9 = uVar9 + 1;
      } while (uVar9 != uVar3);
    }
    TPZFMatrix<int>::~TPZFMatrix(&local_218,&PTR_PTR_01848ef0);
    TPZFMatrix<int>::~TPZFMatrix(&local_398,&PTR_PTR_01848ef0);
  }
  TPZFMatrix<int>::~TPZFMatrix(&local_178,&PTR_PTR_01848530);
  return bVar7;
}

Assistant:

bool TPZMatrix<TVar>::SolveEigensystemJacobi(int64_t &numiterations, REAL & tol, TPZVec<TVar> & Eigenvalues, TPZFMatrix<TVar> & Eigenvectors) const{
	
	int64_t NumIt = numiterations;
	REAL tolerance = tol;
	
#ifdef PZDEBUG2
	if (this->Rows() != this->Cols())
	{
		PZError << __PRETTY_FUNCTION__ <<
		" - Jacobi method of computing eigensystem requires a symmetric square matrix. this->Rows = " << this->Rows() << " - this->Cols() = " << this->Cols() << endl;
		return false;
	}
	
	if (this->VerifySymmetry(1.e-8) == false)
	{
		PZError << __PRETTY_FUNCTION__ <<
		" - Jacobi method of computing eigensystem requires a symmetric square matrix. This matrix is not symmetric." << endl;
		return false;
	}
#endif
	
	const int64_t size = this->Rows();
	
	/** Making a copy of this */
	TPZFNMatrix<9,TVar> Matrix(size,size); //fast constructor in case of this is a stress or strain tensor.
	for(int64_t i = 0; i < size; i++) for(int64_t j = 0; j < size; j++) Matrix(i,j) = this->Get(i,j);
	
	/** Compute Eigenvalues *//////////////////////////////////////
	bool result = Matrix.SolveEigenvaluesJacobi(numiterations, tol, &Eigenvalues);
	if (result == false) return false;
	
	/** Compute Eigenvectors *//////////////////////////////////////
	TPZFNMatrix<3, TVar> VecIni(size,1,0.), VecIni_cp(size,1,0.);
	
	Eigenvectors.Resize(size, size);
	Eigenvectors.Zero();
	for(int64_t eigen = 0; eigen < size; eigen++)
	{
        for(int64_t i = 0; i < size; i++) VecIni.PutVal(i,0,rand());
		
        TPZFNMatrix<9,TVar> Matrix(*this);
		
        TVar answ = ReturnNearestValue(Eigenvalues[eigen], Eigenvalues,((TVar)1.E-5));
        TVar exp = answ - Eigenvalues[eigen];
        if((REAL)(fabs(exp)) > 1.E-5)
        {
            for(int64_t i = 0; i < size; i++) Matrix.PutVal(i,i, this->GetVal(i,i) - (TVar)(Eigenvalues[eigen] - (TVar)(0.01 * fabs(exp))) );
        }
        else
        {
            for(int64_t i = 0; i < size; i++) Matrix.PutVal(i,i, this->GetVal(i,i) - (Eigenvalues[eigen] - TVar(0.01)) );
        }
		
        /** Normalizing Initial Eigenvec */
        REAL norm1 = 0.;
        for(int64_t i = 0; i < size; i++) norm1 += fabs(VecIni(i,0)) * fabs(VecIni(i,0)); norm1 = sqrt(norm1);
        for(int64_t i = 0; i < size; i++) VecIni(i,0) = VecIni(i,0)/(TVar)norm1;
		
        int64_t count = 0;
        double dif = 10., difTemp = 0.;
		
        while(dif > tolerance && count <= NumIt)
        {
			for(int64_t i = 0; i < size; i++) VecIni_cp(i,0) = VecIni(i,0);
			
			/** Estimating Eigenvec */
			Matrix.Solve_LU(&VecIni);
			
			/** Normalizing Final Eigenvec */
			REAL norm2 = 0.;
			for(int64_t i = 0; i < size; i++) norm2 += fabs(VecIni(i,0)) * fabs(VecIni(i,0));
			norm2 = sqrt(norm2);
			
			difTemp = 0.;
			for(int64_t i = 0; i < size; i++)
			{
                VecIni(i,0) = VecIni(i,0)/(TVar)norm2;
                TVar exp = (VecIni_cp(i,0) - VecIni(i,0)) * (VecIni_cp(i,0) - VecIni(i,0));
                difTemp += fabs(exp);
			}
			dif = sqrt(difTemp);
			count++;
        }
		
        /** Copy values from AuxVector to Eigenvectors */
        for(int64_t i = 0; i < size; i++)
        {
			TVar val = VecIni(i,0);
			if((REAL)(fabs(val)) < 1.E-5) val = 0.;
			Eigenvectors(eigen,i) = val;
        }
		
#ifdef PZDEBUG2
        double norm = 0.;
        for(int64_t i = 0; i < size; i++) norm += fabs(VecIni(i,0)) * fabs(VecIni(i,0));
        if (fabs(norm - 1.) > 1.e-10)
        {
            PZError << __PRETTY_FUNCTION__ << endl;
        }
        if(count > NumIt-1)// O metodo nao convergiu !!!
        {
            PZError << __PRETTY_FUNCTION__ << endl;
#ifdef PZ_LOG
            {
                std::stringstream sout;
                Print("Matrix for SolveEigensystemJacobi did not converge",sout);
                LOGPZ_DEBUG(logger,sout.str());
            }
#endif
        }
#endif
	}
	
	return true;
	
}